

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O0

size_t __thiscall kws::Parser::FindFunction(Parser *this,size_t pos,char *buffer)

{
  long lVar1;
  size_t sVar2;
  char *pcVar3;
  char *in_RDX;
  ulong in_RSI;
  long in_RDI;
  bool bVar4;
  size_t i;
  bool nospecialchar;
  size_t beg;
  size_t end;
  string buf;
  string local_b0 [32];
  string local_90 [23];
  undefined1 in_stack_ffffffffffffff87;
  size_t in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff98;
  byte in_stack_ffffffffffffff9f;
  long local_58;
  string local_40 [32];
  char *local_20;
  ulong local_18;
  size_t local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::__cxx11::string::string(local_40,(string *)(in_RDI + 0x518));
  if (local_20 != (char *)0x0) {
    std::__cxx11::string::operator=(local_40,local_20);
  }
  if ((local_18 == 0xffffffffffffffff) ||
     (lVar1 = std::__cxx11::string::size(), lVar1 - 1U < local_18)) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    local_58 = std::__cxx11::string::find((char)local_40,0x7d);
    while ((local_58 != -1 &&
           (sVar2 = FindOpeningChar((Parser *)
                                    CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                                    (char)(in_stack_ffffffffffffff90 >> 0x38),
                                    (char)(in_stack_ffffffffffffff90 >> 0x30),
                                    in_stack_ffffffffffffff88,(bool)in_stack_ffffffffffffff87),
           sVar2 != 0xffffffffffffffff))) {
      in_stack_ffffffffffffff9f = 1;
      in_stack_ffffffffffffff90 = sVar2;
      while ((in_stack_ffffffffffffff90 = in_stack_ffffffffffffff90 - 1,
             in_stack_ffffffffffffff90 != 0xffffffffffffffff &&
             (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_40), *pcVar3 != ')')))
      {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
        if ((*pcVar3 != ' ') &&
           ((pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_40), *pcVar3 != '\r' &&
            (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_40), *pcVar3 != '\n'))))
        {
          in_stack_ffffffffffffff9f = 0;
        }
      }
      local_8 = sVar2;
      if ((in_stack_ffffffffffffff9f & 1) != 0) goto LAB_00138f92;
      if (in_stack_ffffffffffffff90 != 0xffffffffffffffff) {
        std::__cxx11::string::substr((ulong)local_90,(ulong)local_40);
        lVar1 = std::__cxx11::string::find((char *)local_90,0x1d8ef9);
        bVar4 = false;
        if (lVar1 == -1) {
          std::__cxx11::string::substr((ulong)local_b0,(ulong)local_40);
          lVar1 = std::__cxx11::string::find((char *)local_b0,0x1dceb1);
          bVar4 = lVar1 != -1;
          std::__cxx11::string::~string(local_b0);
        }
        std::__cxx11::string::~string(local_90);
        if (bVar4) goto LAB_00138f92;
      }
      local_58 = std::__cxx11::string::find((char)local_40,0x7d);
    }
    local_8 = 0xffffffffffffffff;
  }
LAB_00138f92:
  std::__cxx11::string::~string(local_40);
  return local_8;
}

Assistant:

size_t Parser::FindFunction(size_t pos,const char* buffer) const
{
  std::string buf = m_BufferNoComment;

  if(buffer)
    {
    buf = buffer;
    }

  if((pos == std::string::npos) || pos > buf.size()-1)
    {
    return std::string::npos;
    }

  // a function is defined as:
  // function() [const] {}; and if() {} is considered as a function
  // here.

  // We go backwards
  size_t end = buf.find('}',pos);
  while(end != std::string::npos)
    {
    size_t beg = this->FindOpeningChar('}','{',end,true);
    if(beg == std::string::npos)
        {
        break;
        }

    // check that before the beg we have
    bool nospecialchar=true;
    size_t i = beg-1;
    while(i != std::string::npos)
      {
      if(buf[i] == ')')
        {
        break;
        }
      else if(
        buf[i] != ' ' && buf[i] != '\r'
        && buf[i] != '\n'
        )
        {
        nospecialchar = false;
        }
      --i;
      }

    if(nospecialchar)
      {
      return beg;
      }
    if(i != std::string::npos)// check if we have a const
      {
      if(buf.substr(i,beg-i).find("]") == std::string::npos &&
         buf.substr(i,beg-i).find("const") != std::string::npos
        )
        {
        return beg;
        }
      }
    end = buf.find('}',end+1);
    }

  return std::string::npos;
}